

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SOIL.c
# Opt level: O2

int SOIL_save_image(char *filename,int image_type,int width,int height,int channels,uchar *data)

{
  int iVar1;
  
  iVar1 = 0;
  if ((((filename != (char *)0x0) && (data != (uchar *)0x0)) && (0 < width)) &&
     ((iVar1 = 0, 0 < height && (0xfffffffb < channels - 5U)))) {
    if (image_type == 0) {
      iVar1 = stbi_write_tga(filename,width,height,channels,data);
    }
    else if (image_type == 2) {
      iVar1 = save_image_as_DDS(filename,width,height,channels,data);
    }
    else {
      if (image_type != 1) {
        result_string_pointer = "Saving the image failed";
        return 0;
      }
      iVar1 = stbi_write_bmp(filename,width,height,channels,data);
    }
    result_string_pointer = "Image saved";
    if (iVar1 == 0) {
      result_string_pointer = "Saving the image failed";
    }
  }
  return iVar1;
}

Assistant:

int
	SOIL_save_image
	(
		const char *filename,
		int image_type,
		int width, int height, int channels,
		const unsigned char *const data
	)
{
	int save_result;

	/*	error check	*/
	if( (width < 1) || (height < 1) ||
		(channels < 1) || (channels > 4) ||
		(data == NULL) ||
		(filename == NULL) )
	{
		return 0;
	}
	if( image_type == SOIL_SAVE_TYPE_BMP )
	{
		save_result = stbi_write_bmp( filename,
				width, height, channels, (void*)data );
	} else
	if( image_type == SOIL_SAVE_TYPE_TGA )
	{
		save_result = stbi_write_tga( filename,
				width, height, channels, (void*)data );
	} else
	if( image_type == SOIL_SAVE_TYPE_DDS )
	{
		save_result = save_image_as_DDS( filename,
				width, height, channels, (const unsigned char *const)data );
	} else
	{
		save_result = 0;
	}
	if( save_result == 0 )
	{
		result_string_pointer = "Saving the image failed";
	} else
	{
		result_string_pointer = "Image saved";
	}
	return save_result;
}